

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_advance(Tree *this,lookup_result *r,size_t more)

{
  bool bVar1;
  error_flags eVar2;
  char *in_RDX;
  basic_substring<const_char> *in_RSI;
  size_t in_stack_ffffffffffffffb0;
  
  in_RSI[1].str = in_RDX + (long)in_RSI[1].str;
  if (in_RSI[2].str < in_RSI[1].str) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x347f4b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring(in_RSI,in_RDX,in_stack_ffffffffffffffb0);
  bVar1 = basic_substring<const_char>::begins_with
                    ((basic_substring<const_char> *)&stack0xffffffffffffffa8,'.');
  if (bVar1) {
    in_RSI[1].str = in_RSI[1].str + 1;
  }
  return;
}

Assistant:

void Tree::_advance(lookup_result *r, size_t more) const
{
    r->path_pos += more;
    if(r->path.sub(r->path_pos).begins_with('.'))
        ++r->path_pos;
}